

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O0

void __thiscall
RVO::KdTree::buildAgentTreeRecursive(KdTree *this,size_t begin,size_t end,size_t node)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  bool bVar4;
  reference pvVar5;
  reference ppAVar6;
  float *pfVar7;
  reference __b;
  size_t sVar8;
  size_t sVar9;
  float fVar10;
  float local_e8;
  float local_e0;
  float local_d0;
  ulong local_58;
  size_t right;
  size_t left;
  float splitValue;
  float fStack_3c;
  bool isVertical;
  float local_38;
  float local_34;
  ulong local_30;
  size_t i;
  size_t node_local;
  size_t end_local;
  size_t begin_local;
  KdTree *this_local;
  
  i = node;
  node_local = end;
  end_local = begin;
  begin_local = (size_t)this;
  pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[](&this->agentTree_,node);
  sVar8 = node_local;
  pvVar5->begin = begin;
  pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[](&this->agentTree_,i);
  pvVar5->end = sVar8;
  ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                      (&this->agents_,end_local);
  fVar10 = Vector2::x(&(*ppAVar6)->position_);
  pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[](&this->agentTree_,i);
  pvVar5->maxX = fVar10;
  pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[](&this->agentTree_,i);
  pvVar5->minX = fVar10;
  ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                      (&this->agents_,end_local);
  fVar10 = Vector2::y(&(*ppAVar6)->position_);
  pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[](&this->agentTree_,i);
  pvVar5->maxY = fVar10;
  pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
           operator[](&this->agentTree_,i);
  pvVar5->minY = fVar10;
  local_30 = end_local;
  while (local_30 = local_30 + 1, local_30 < node_local) {
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                        (&this->agents_,local_30);
    local_34 = Vector2::x(&(*ppAVar6)->position_);
    pfVar7 = std::max<float>(&pvVar5->maxX,&local_34);
    fVar10 = *pfVar7;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar5->maxX = fVar10;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                        (&this->agents_,local_30);
    local_38 = Vector2::x(&(*ppAVar6)->position_);
    pfVar7 = std::min<float>(&pvVar5->minX,&local_38);
    fVar10 = *pfVar7;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar5->minX = fVar10;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                        (&this->agents_,local_30);
    fStack_3c = Vector2::y(&(*ppAVar6)->position_);
    pfVar7 = std::max<float>(&pvVar5->maxY,&stack0xffffffffffffffc4);
    fVar10 = *pfVar7;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar5->maxY = fVar10;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                        (&this->agents_,local_30);
    splitValue = Vector2::y(&(*ppAVar6)->position_);
    pfVar7 = std::min<float>(&pvVar5->minY,&splitValue);
    fVar10 = *pfVar7;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar5->minY = fVar10;
  }
  if (10 < node_local - end_local) {
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    fVar10 = pvVar5->maxX;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    fVar1 = pvVar5->minX;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    fVar2 = pvVar5->maxY;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    bVar4 = fVar10 - fVar1 <= fVar2 - pvVar5->minY;
    if (bVar4) {
      pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
               ::operator[](&this->agentTree_,i);
      local_d0 = pvVar5->maxY;
      pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
               ::operator[](&this->agentTree_,i);
      local_d0 = local_d0 + pvVar5->minY;
    }
    else {
      pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
               ::operator[](&this->agentTree_,i);
      local_d0 = pvVar5->maxX;
      pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
               ::operator[](&this->agentTree_,i);
      local_d0 = local_d0 + pvVar5->minX;
    }
    local_d0 = local_d0 * 0.5;
    right = end_local;
    local_58 = node_local;
    while (right < local_58) {
      while( true ) {
        bVar3 = false;
        if (right < local_58) {
          if (bVar4) {
            ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                                (&this->agents_,right);
            local_e0 = Vector2::y(&(*ppAVar6)->position_);
          }
          else {
            ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                                (&this->agents_,right);
            local_e0 = Vector2::x(&(*ppAVar6)->position_);
          }
          bVar3 = local_e0 < local_d0;
        }
        if (!bVar3) break;
        right = right + 1;
      }
      while( true ) {
        bVar3 = false;
        if (right < local_58) {
          if (bVar4) {
            ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                                (&this->agents_,local_58 - 1);
            local_e8 = Vector2::y(&(*ppAVar6)->position_);
          }
          else {
            ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                                (&this->agents_,local_58 - 1);
            local_e8 = Vector2::x(&(*ppAVar6)->position_);
          }
          bVar3 = local_d0 <= local_e8;
        }
        if (!bVar3) break;
        local_58 = local_58 - 1;
      }
      if (right < local_58) {
        ppAVar6 = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                            (&this->agents_,right);
        __b = std::vector<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::operator[]
                        (&this->agents_,local_58 - 1);
        std::swap<RVO::Agent*>(ppAVar6,__b);
        right = right + 1;
        local_58 = local_58 - 1;
      }
    }
    if (right == end_local) {
      right = right + 1;
    }
    sVar8 = i + 1;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    pvVar5->left = sVar8;
    sVar9 = i + (right - end_local) * 2;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    sVar8 = end_local;
    pvVar5->right = sVar9;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    buildAgentTreeRecursive(this,sVar8,right,pvVar5->left);
    sVar8 = node_local;
    pvVar5 = std::vector<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>::
             operator[](&this->agentTree_,i);
    buildAgentTreeRecursive(this,right,sVar8,pvVar5->right);
  }
  return;
}

Assistant:

void KdTree::buildAgentTreeRecursive(size_t begin, size_t end, size_t node)
	{
		agentTree_[node].begin = begin;
		agentTree_[node].end = end;
		agentTree_[node].minX = agentTree_[node].maxX = agents_[begin]->position_.x();
		agentTree_[node].minY = agentTree_[node].maxY = agents_[begin]->position_.y();

		for (size_t i = begin + 1; i < end; ++i) {
			agentTree_[node].maxX = std::max(agentTree_[node].maxX, agents_[i]->position_.x());
			agentTree_[node].minX = std::min(agentTree_[node].minX, agents_[i]->position_.x());
			agentTree_[node].maxY = std::max(agentTree_[node].maxY, agents_[i]->position_.y());
			agentTree_[node].minY = std::min(agentTree_[node].minY, agents_[i]->position_.y());
		}

		if (end - begin > MAX_LEAF_SIZE) {
			/* No leaf node. */
			const bool isVertical = (agentTree_[node].maxX - agentTree_[node].minX > agentTree_[node].maxY - agentTree_[node].minY);
			const float splitValue = (isVertical ? 0.5f * (agentTree_[node].maxX + agentTree_[node].minX) : 0.5f * (agentTree_[node].maxY + agentTree_[node].minY));

			size_t left = begin;
			size_t right = end;

			while (left < right) {
				while (left < right && (isVertical ? agents_[left]->position_.x() : agents_[left]->position_.y()) < splitValue) {
					++left;
				}

				while (right > left && (isVertical ? agents_[right - 1]->position_.x() : agents_[right - 1]->position_.y()) >= splitValue) {
					--right;
				}

				if (left < right) {
					std::swap(agents_[left], agents_[right - 1]);
					++left;
					--right;
				}
			}

			if (left == begin) {
				++left;
				++right;
			}

			agentTree_[node].left = node + 1;
			agentTree_[node].right = node + 2 * (left - begin);

			buildAgentTreeRecursive(begin, left, agentTree_[node].left);
			buildAgentTreeRecursive(left, end, agentTree_[node].right);
		}
	}